

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::postprocess_dirty_nodes(Simulator *this)

{
  Value VVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  reference puVar5;
  reference pvVar6;
  size_type sVar7;
  reference puVar8;
  reference pvVar9;
  reference pvVar10;
  _Rb_tree_const_iterator<unsigned_int> local_38;
  uint local_30;
  uint local_2c;
  pin_t pin;
  uint node_id;
  iterator __end1;
  iterator __begin1;
  node_container_t *__range1;
  Simulator *this_local;
  
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     (&this->m_dirty_nodes_write);
  _pin = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->m_dirty_nodes_write);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&pin);
    if (!bVar4) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_2c = *puVar5;
    pvVar6 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                       (&this->m_node_metadata,(ulong)local_2c);
    sVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                      (&pvVar6->m_active_pins);
    if (sVar7 == 0) {
      pvVar6 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                         (&this->m_node_metadata,(ulong)local_2c);
      VVar1 = pvVar6->m_default;
      pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_node_values_write,(ulong)local_2c);
      *pvVar9 = VVar1;
      vVar3 = this->m_time;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->m_node_write_time,(ulong)local_2c);
      *pvVar10 = vVar3;
    }
    else if (sVar7 == 1) {
      pvVar6 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                         (&this->m_node_metadata,(ulong)local_2c);
      local_38._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (&pvVar6->m_active_pins);
      puVar8 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_38);
      local_30 = *puVar8;
      pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_pin_values,(ulong)local_30);
      vVar2 = *pvVar9;
      pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_node_values_write,(ulong)local_2c);
      *pvVar9 = vVar2;
      vVar3 = this->m_time;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->m_node_write_time,(ulong)local_2c);
      *pvVar10 = vVar3;
    }
    else {
      pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_node_values_write,(ulong)local_2c);
      *pvVar9 = VALUE_ERROR;
    }
    pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                       (&this->m_node_values_read,(ulong)local_2c);
    vVar2 = *pvVar9;
    pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                       (&this->m_node_values_write,(ulong)local_2c);
    if (vVar2 != *pvVar9) {
      vVar3 = this->m_time;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->m_node_change_time,(ulong)local_2c);
      *pvVar10 = vVar3;
      pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_node_values_write,(ulong)local_2c);
      vVar2 = *pvVar9;
      pvVar9 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_node_values_read,(ulong)local_2c);
      *pvVar9 = vVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_dirty_nodes_read,&local_2c);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_dirty_nodes_write);
  return;
}

Assistant:

void Simulator::postprocess_dirty_nodes() {

    for (auto node_id : m_dirty_nodes_write) {

        switch (m_node_metadata[node_id].m_active_pins.size()) {
            case 0 :        // no active writers: use default value (i.e. pull-up/down resistor)
                m_node_values_write[node_id] = m_node_metadata[node_id].m_default;
                m_node_write_time[node_id] = m_time;
                break;
            case 1 : {      // normal case - 1 active writer
                pin_t pin = *m_node_metadata[node_id].m_active_pins.begin();
                m_node_values_write[node_id] = m_pin_values[pin];
                m_node_write_time[node_id] = m_time;
                break;
            }
            default :       // multiple active writers
               m_node_values_write[node_id] = VALUE_ERROR;
               break;
        }

        if (m_node_values_read[node_id] != m_node_values_write[node_id]) {
            m_node_change_time[node_id] = m_time;
            m_node_values_read[node_id] = m_node_values_write[node_id];
            m_dirty_nodes_read.push_back(node_id);
        }
    }

    m_dirty_nodes_write.clear();
}